

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O2

bool __thiscall
psy::C::Parser::parsePostfixExpression_AtFollowOfPrimary<psy::C::CallExpressionSyntax>
          (Parser *this,ExpressionSyntax **expr,SyntaxKind exprK,
          function<bool_(psy::C::CallExpressionSyntax_*&)> *parsePostfix)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  ostream *poVar3;
  SyntaxKind exprK_local;
  CallExpressionSyntax *postfixExpr;
  
  exprK_local = exprK;
  pSVar2 = peek(this,1);
  if ((((pSVar2->syntaxK_ != OpenBracketToken) &&
       (pSVar2 = peek(this,1), pSVar2->syntaxK_ != OpenParenToken)) &&
      (pSVar2 = peek(this,1), pSVar2->syntaxK_ != DotToken)) &&
     (((pSVar2 = peek(this,1), pSVar2->syntaxK_ != ArrowToken &&
       (pSVar2 = peek(this,1), pSVar2->syntaxK_ != PlusPlusToken)) &&
      (pSVar2 = peek(this,1), pSVar2->syntaxK_ != MinusMinusToken)))) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x2af);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"assert failure: `[\', `(\', `.\', `->\', \'++\', or `--\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    return false;
  }
  postfixExpr = makeNode<psy::C::CallExpressionSyntax,psy::C::SyntaxKind&>(this,&exprK_local);
  postfixExpr->expr_ = *expr;
  *expr = &postfixExpr->super_ExpressionSyntax;
  bVar1 = std::function<bool_(psy::C::CallExpressionSyntax_*&)>::operator()
                    (parsePostfix,&postfixExpr);
  return bVar1;
}

Assistant:

bool Parser::parsePostfixExpression_AtFollowOfPrimary(
        ExpressionSyntax*& expr,
        SyntaxKind exprK,
        std::function<bool(ExprT*&)> parsePostfix)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::OpenBracketToken
                        || peek().kind() == SyntaxKind::OpenParenToken
                        || peek().kind() == SyntaxKind::DotToken
                        || peek().kind() == SyntaxKind::ArrowToken
                        || peek().kind() == SyntaxKind::PlusPlusToken
                        || peek().kind() == SyntaxKind::MinusMinusToken,
                  return false,
                  "assert failure: `[', `(', `.', `->', '++', or `--'");

    auto postfixExpr = makeNode<ExprT>(exprK);
    postfixExpr->expr_ = expr;
    expr = postfixExpr;
    return parsePostfix(postfixExpr);
}